

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

shared_ptr<const_std::exception>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<const_std::exception>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  _Base_ptr *this;
  Type_Conversions *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<const_std::exception> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<const_std::exception> sVar5;
  
  pTVar1 = (param_2->m_conversions)._M_data;
  this = &(pTVar1->m_conversions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (((pTVar1->m_conversions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black) ==
      _S_red) {
    psVar3 = (shared_ptr<const_std::exception> *)
             Any::cast<std::shared_ptr<std::exception>>((Any *)this);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    psVar3 = Any::cast<std::shared_ptr<std::exception_const>>((Any *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         ((__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2> *)
         &psVar3->super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr;
  p_Var2 = (((__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2> *)
            &psVar3->super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>)->
           _M_refcount)._M_pi;
  (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar5.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ob;
  return (shared_ptr<const_std::exception>)
         sVar5.super___shared_ptr<const_std::exception,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) {
        if (!ob.get_type_info().is_const()) {
          return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result>>());
        } else {
          return ob.get().cast<std::shared_ptr<const Result>>();
        }
      }